

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

float32 cal_constD(vector_t in_mean,vector_t wt_num_mean,vector_t wt_den_mean,vector_t in_var,
                  vector_t wt_num_var,vector_t wt_den_var,float32 num_dnom,float32 den_dnom,
                  uint32 n_veclen,float32 constE)

{
  float fVar1;
  uint32 uVar2;
  ulong uVar3;
  float fVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  float64 root2;
  float64 root1;
  double local_40;
  double local_38;
  
  fVar6 = 0.0;
  fVar4 = 0.0;
  for (uVar3 = 0; n_veclen != uVar3; uVar3 = uVar3 + 1) {
    fVar1 = in_mean[uVar3];
    fVar7 = wt_num_mean[uVar3] - wt_den_mean[uVar3];
    uVar2 = solve_quadratic((float64)(double)in_var[uVar3],
                            (float64)(double)(fVar1 * -2.0 * fVar7 +
                                             (fVar1 * fVar1 + in_var[uVar3]) *
                                             ((float)num_dnom - (float)den_dnom) +
                                             (wt_num_var[uVar3] - wt_den_var[uVar3])),
                            (float64)(double)((wt_num_var[uVar3] - wt_den_var[uVar3]) *
                                              ((float)num_dnom - (float)den_dnom) - fVar7 * fVar7),
                            (float64 *)&local_38,(float64 *)&local_40);
    if (uVar2 != 0) {
      dVar5 = local_38;
      if (local_38 <= local_40) {
        dVar5 = local_40;
      }
      fVar6 = (float)(dVar5 + dVar5);
    }
    if (fVar6 <= (float)constE * (float)den_dnom) {
      fVar6 = (float)constE * (float)den_dnom;
    }
    if (fVar4 <= fVar6) {
      fVar4 = fVar6;
    }
  }
  return (float32)fVar4;
}

Assistant:

float32
cal_constD(vector_t in_mean,
	   vector_t wt_num_mean,
	   vector_t wt_den_mean,
	   vector_t in_var,
	   vector_t wt_num_var,
	   vector_t wt_den_var,
	   float32 num_dnom,
	   float32 den_dnom,
	   uint32 n_veclen,
	   float32 constE)
{
    uint32 l;
    float32 d = 0.0;
    float64 x, y, z;
    float64 root1, root2;
    float32 d_mmi = 0.0;
    
    for (l = 0; l < n_veclen; l++) {
	x = in_var[l];
	y = (in_var[l] + in_mean[l]*in_mean[l]) * (num_dnom - den_dnom) + (wt_num_var[l] - wt_den_var[l])
	    - 2*in_mean[l]*(wt_num_mean[l] - wt_den_mean[l]);
	z = (wt_num_var[l] - wt_den_var[l]) * (num_dnom - den_dnom) - (wt_num_mean[l] - wt_den_mean[l]) * (wt_num_mean[l] - wt_den_mean[l]);
	
	if (solve_quadratic(x, y, z, &root1, &root2))
	    d = MAX(root1, root2) * D_FACTOR;
	
	d = MAX(d, constE*den_dnom);
	
	d_mmi = MAX(d_mmi, d);
    }
    
    return d_mmi;
}